

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_long_vowel.c
# Opt level: O1

void njd_set_long_vowel(NJD *njd)

{
  return;
}

Assistant:

void njd_set_long_vowel(NJD * njd)
{
#if 1
   /* long vowel estimator is deprecated */
   return;
#else
   int i, j;
   NJDNode *node;
   const char *str;
   int len;
   char buff[MAXBUFLEN];
   int byte = -1;

   for (node = njd->head; node != NULL; node = node->next) {
      /* initialize */
      str = NJDNode_get_pron(node);
      len = strlen(str);
      buff[0] = '\0';
      /* search */
      for (i = 0; i < len; i += byte) {
         byte = -1;
         for (j = 0; njd_set_long_vowel_table[j] != NULL; j += 2) {
            byte = strtopcmp(&str[i], njd_set_long_vowel_table[j]);
            if (byte > 0) {
               /* find */
               strcat(buff, njd_set_long_vowel_table[j + 1]);
               break;
            }
         }
         /* not found */
         if (byte < 0) {
            byte = detect_byte(&str[i]);
            strncat(buff, &str[i], byte);
         }
      }
      /* finish */
      NJDNode_set_pron(node, buff);
   }
#endif
}